

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

void __thiscall
CVmObjStringBuffer::splice_text
          (CVmObjStringBuffer *this,vm_obj_id_t self,int32_t idx,int32_t del_chars,wchar_t *src,
          int32_t ins_chars,int undo)

{
  int iVar1;
  int *piVar2;
  int32_t old_len;
  uint new_len;
  int idx_00;
  
  piVar2 = (int *)(this->super_CVmObject).ext_;
  idx_00 = 0;
  if ((-1 < idx) && (iVar1 = *piVar2, idx_00 = idx, iVar1 < idx)) {
    idx_00 = iVar1;
  }
  old_len = 0;
  if ((-1 < del_chars) && (iVar1 = *piVar2, old_len = iVar1 - idx_00, idx_00 + del_chars <= iVar1))
  {
    old_len = del_chars;
  }
  new_len = 0;
  if (0 < ins_chars) {
    new_len = ins_chars;
  }
  if (undo != 0) {
    add_undo_rec(this,self,STRBUF_UNDO_REPL,idx_00,old_len,new_len);
  }
  splice_move(this,idx_00,old_len,new_len);
  memcpy((this->super_CVmObject).ext_ + (long)idx_00 * 4 + 0xc,src,(ulong)new_len << 2);
  return;
}

Assistant:

void CVmObjStringBuffer::splice_text(VMG_ vm_obj_id_t self,
                                     int32_t idx, int32_t del_chars,
                                     const wchar_t *src, int32_t ins_chars,
                                     int undo)
{
    /* check arguments */
    adjust_args(&idx, &del_chars, &ins_chars);

    /* if desired, save undo */
    if (undo)
        add_undo_rec(vmg_ self, STRBUF_UNDO_REPL, idx, del_chars, ins_chars);

    /* delete the old characters and open a gap for the new characters */
    splice_move(vmg_ idx, del_chars, ins_chars);

    /* copy in the characters */
    memcpy(get_ext()->buf + idx, src, ins_chars * sizeof(get_ext()->buf[0]));
}